

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  bool bVar1;
  int iVar2;
  double local_80;
  double arg1f_2;
  double arg0f_1;
  double *v_2;
  float arg1f_1;
  float arg0f;
  float *v_1;
  float arg1f;
  int arg0i;
  int *v;
  int arg1i;
  int data_backup [2];
  char op;
  char *format_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *initial_value_buf_local;
  char *buf_local;
  
  unique0x100003c2 = format;
  initial_value_buf_local = buf;
  while (bVar1 = ImCharIsBlankA(*initial_value_buf_local), bVar1) {
    initial_value_buf_local = initial_value_buf_local + 1;
  }
  data_backup[0]._3_1_ = *initial_value_buf_local;
  if (((data_backup[0]._3_1_ == '+') || (data_backup[0]._3_1_ == '*')) ||
     (data_backup[0]._3_1_ == '/')) {
    do {
      initial_value_buf_local = initial_value_buf_local + 1;
      bVar1 = ImCharIsBlankA(*initial_value_buf_local);
    } while (bVar1);
  }
  else {
    data_backup[0]._3_1_ = '\0';
  }
  if (*initial_value_buf_local == '\0') {
    return false;
  }
  if (5 < data_type) {
    __assert_fail("data_type < ImGuiDataType_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x21c4,
                  "bool DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                 );
  }
  if (GDataTypeInfo[data_type].Size < 9) {
    memcpy((void *)((long)&v + 4),data_ptr,GDataTypeInfo[data_type].Size);
    if (stack0xffffffffffffffc8 == (char *)0x0) {
      unique0x00012000 = GDataTypeInfo[data_type].ScanFmt;
    }
    v._0_4_ = 0;
    if (data_type == 0) {
      v_1._4_4_ = *data_ptr;
      v_1._0_4_ = 0.0;
      _arg1f = (int *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,stack0xffffffffffffffc8,(long)&v_1 + 4),
         iVar2 < 1)) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%d",&v);
        if (iVar2 != 0) {
          *_arg1f = v_1._4_4_ + (int)v;
        }
      }
      else if (data_backup[0]._3_1_ == '*') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",&v_1);
        if (iVar2 != 0) {
          *_arg1f = (int)((float)v_1._4_4_ * v_1._0_4_);
        }
      }
      else if (data_backup[0]._3_1_ == '/') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",&v_1);
        if ((iVar2 != 0) && ((v_1._0_4_ != 0.0 || (NAN(v_1._0_4_))))) {
          *_arg1f = (int)((float)v_1._4_4_ / v_1._0_4_);
        }
      }
      else {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,&v);
        if (iVar2 == 1) {
          *_arg1f = (int)v;
        }
      }
    }
    else if (((data_type == 1) || (data_type == 2)) || (data_type == 3)) {
      __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,data_ptr);
    }
    else if (data_type == 4) {
      stack0xffffffffffffffc8 = "%f";
      v_2._4_4_ = *data_ptr;
      v_2._0_4_ = 0.0;
      _arg1f_1 = (float *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,"%f",(long)&v_2 + 4), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,&v_2);
      if (iVar2 < 1) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        *_arg1f_1 = v_2._4_4_ + v_2._0_4_;
      }
      else if (data_backup[0]._3_1_ == '*') {
        *_arg1f_1 = v_2._4_4_ * v_2._0_4_;
      }
      else if (data_backup[0]._3_1_ == '/') {
        if ((v_2._0_4_ != 0.0) || (NAN(v_2._0_4_))) {
          *_arg1f_1 = v_2._4_4_ / v_2._0_4_;
        }
      }
      else {
        *_arg1f_1 = v_2._0_4_;
      }
    }
    else if (data_type == 5) {
      stack0xffffffffffffffc8 = "%lf";
      arg1f_2 = *data_ptr;
      local_80 = 0.0;
      arg0f_1 = (double)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,"%lf",&arg1f_2), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,&local_80);
      if (iVar2 < 1) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        *(double *)arg0f_1 = arg1f_2 + local_80;
      }
      else if (data_backup[0]._3_1_ == '*') {
        *(double *)arg0f_1 = arg1f_2 * local_80;
      }
      else if (data_backup[0]._3_1_ == '/') {
        if ((local_80 != 0.0) || (NAN(local_80))) {
          *(double *)arg0f_1 = arg1f_2 / local_80;
        }
      }
      else {
        *(double *)arg0f_1 = local_80;
      }
    }
    iVar2 = memcmp((void *)((long)&v + 4),data_ptr,GDataTypeInfo[data_type].Size);
    return iVar2 != 0;
  }
  __assert_fail("GDataTypeInfo[data_type].Size <= sizeof(data_backup)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x21c6,
                "bool DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
               );
}

Assistant:

static bool DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    IM_ASSERT(GDataTypeInfo[data_type].Size <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, GDataTypeInfo[data_type].Size);

    if (format == NULL)
        format = GDataTypeInfo[data_type].ScanFmt;

    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)data_ptr;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // Assign constant
        // FIXME: We don't bother handling support for legacy operators since they are a little too crappy. Instead we may implement a proper expression evaluator in the future.
        sscanf(buf, format, data_ptr);
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    return memcmp(data_backup, data_ptr, GDataTypeInfo[data_type].Size) != 0;
}